

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O0

void __thiscall xercesc_4_0::QName::setNLocalPart(QName *this,XMLCh *localPart,XMLSize_t newLen)

{
  int iVar1;
  undefined4 extraout_var;
  XMLSize_t newLen_local;
  XMLCh *localPart_local;
  QName *this_local;
  
  if ((this->fLocalPartBufSz == 0) || (this->fLocalPartBufSz < newLen)) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fLocalPart);
    this->fLocalPart = (XMLCh *)0x0;
    this->fLocalPartBufSz = newLen + 8;
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(this->fLocalPartBufSz + 1) * 2);
    this->fLocalPart = (XMLCh *)CONCAT44(extraout_var,iVar1);
  }
  XMLString::moveChars(this->fLocalPart,localPart,newLen);
  this->fLocalPart[newLen] = L'\0';
  return;
}

Assistant:

void QName::setNLocalPart(const XMLCh* localPart, const XMLSize_t newLen)
{
    if (!fLocalPartBufSz || (newLen > fLocalPartBufSz))
    {
        fMemoryManager->deallocate(fLocalPart); //delete [] fLocalPart;
        fLocalPart = 0;
        fLocalPartBufSz = newLen + 8;
        fLocalPart = (XMLCh*) fMemoryManager->allocate
        (
            (fLocalPartBufSz + 1) * sizeof(XMLCh)
        ); //new XMLCh[fLocalPartBufSz + 1];
    }
    XMLString::moveChars(fLocalPart, localPart, newLen);
    fLocalPart[newLen] = chNull;
}